

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_common.cpp
# Opt level: O1

client_pipe __thiscall pstore::brokerface::fifo_path::open_client_pipe(fifo_path *this)

{
  int iVar1;
  bool bVar2;
  undefined4 uVar3;
  int *piVar4;
  uint uVar5;
  fifo_path *in_RSI;
  ostringstream str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  __native_type local_1a8 [9];
  
  (this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__lock = -1;
  uVar5 = 1;
  do {
    local_1a8[0].__data.__lock = 0;
    if ((in_RSI->update_cb_).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_001660cb:
      std::__throw_bad_function_call();
      goto LAB_001660d0;
    }
    (*(in_RSI->update_cb_)._M_invoker)
              ((_Any_data *)&in_RSI->update_cb_,(operation *)local_1a8[0].__size);
    open_impl((fifo_path *)&local_1a8[0].__data);
    if (local_1a8 != (__native_type *)this) {
      details::descriptor<pstore::details::posix_descriptor_traits>::reset
                ((descriptor<pstore::details::posix_descriptor_traits> *)this,-1);
      uVar3 = local_1a8[0].__data.__lock;
      local_1a8[0].__data.__lock = -1;
      (this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__lock = uVar3;
    }
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    if (-1 < (int)local_1a8[0]._0_4_) {
      close(local_1a8[0].__data.__lock);
    }
    local_1a8[0].__data.__lock = -1;
    *piVar4 = iVar1;
    if (-1 < (this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__lock) break;
    local_1a8[0].__data.__lock = 1;
    if ((in_RSI->update_cb_).super__Function_base._M_manager == (_Manager_type)0x0)
    goto LAB_001660cb;
    (*(in_RSI->update_cb_)._M_invoker)
              ((_Any_data *)&in_RSI->update_cb_,(operation *)local_1a8[0].__size);
    wait_until_impl(in_RSI,(milliseconds)(in_RSI->retry_timeout_).__r);
    bVar2 = uVar5 <= in_RSI->max_retries_;
    uVar5 = uVar5 + 1;
  } while (bVar2 || in_RSI->max_retries_ == 0xffffffff);
  if (-1 < (this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__lock) {
    return (client_pipe)this;
  }
LAB_001660d0:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8[0].__data);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8[0].__data,"Could not open client named pipe ",0x21);
  local_1c8._M_dataplus._M_p = (pointer)&in_RSI->path_;
  local_1c8._M_string_length._0_2_ = 0x22;
  std::__detail::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)&local_1a8[0].__data,
             (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
              *)&local_1c8);
  std::__cxx11::stringbuf::str();
  raise<pstore::error_code,std::__cxx11::string>(unable_to_open_named_pipe,&local_1c8);
}

Assistant:

auto fifo_path::open_client_pipe () const -> client_pipe {
            client_pipe fd{};
            auto tries = 0U;
            for (; max_retries_ == infinite_retries || tries <= max_retries_; ++tries) {
                update_cb_ (operation::open);
                fd = this->open_impl ();
                if (fd.valid ()) {
                    break;
                }
                update_cb_ (operation::wait);
                this->wait_until_impl (retry_timeout_);
            }

            if (!fd.valid ()) {
                std::ostringstream str;
                str << "Could not open client named pipe " << pstore::quoted (path_);
                raise (error_code::unable_to_open_named_pipe, str.str ());
            }
            return fd;
        }